

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O1

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitUnary(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
           *this,UnaryExpr e)

{
  Writer *pWVar1;
  char *__s;
  Buffer<char> *pBVar2;
  size_t sVar3;
  size_t __n;
  ptrdiff_t _Num;
  ulong uVar4;
  char *str;
  
  pWVar1 = this->writer_;
  __s = internal::ExprInfo::INFO
        [*(uint *)e.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.impl_].str
  ;
  __n = strlen(__s);
  pBVar2 = pWVar1->buffer_;
  uVar4 = pBVar2->size_ + __n;
  if (pBVar2->capacity_ < uVar4) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar4);
  }
  if (__n != 0) {
    memmove(pBVar2->ptr_ + pBVar2->size_,__s,__n);
  }
  pBVar2->size_ = uVar4;
  pBVar2 = pWVar1->buffer_;
  if (pBVar2->size_ == pBVar2->capacity_) {
    (**pBVar2->_vptr_Buffer)(pBVar2,pBVar2->size_ + 1);
  }
  sVar3 = pBVar2->size_;
  pBVar2->size_ = sVar3 + 1;
  pBVar2->ptr_[sVar3] = '(';
  Visit(this,(NumericExpr)
             ((ExprBase *)
             ((long)e.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.impl_ +
             8))->impl_,0);
  pBVar2 = this->writer_->buffer_;
  if (pBVar2->size_ == pBVar2->capacity_) {
    (**pBVar2->_vptr_Buffer)(pBVar2,pBVar2->size_ + 1);
  }
  sVar3 = pBVar2->size_;
  pBVar2->size_ = sVar3 + 1;
  pBVar2->ptr_[sVar3] = ')';
  return;
}

Assistant:

void VisitUnary(UnaryExpr e) {
    writer_ << str(e.kind()) << '(';
    Visit(e.arg(), prec::UNKNOWN);
    writer_ << ')';
  }